

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O3

void __thiscall
wasm::ModuleSplitting::anon_unknown_0::ModuleSplitter::exportImportFunction
          (ModuleSplitter *this,Name funcName)

{
  Config *pCVar1;
  IString *pIVar2;
  Module *pMVar3;
  char *pcVar4;
  Name name;
  Name name_00;
  iterator iVar5;
  long *plVar6;
  Export *pEVar7;
  string_view *psVar8;
  Function *pFVar9;
  long *plVar10;
  string_view sVar11;
  string_view s;
  string_view s_00;
  Name name_01;
  undefined1 local_88 [32];
  undefined1 auStack_68 [8];
  Name funcName_local;
  char *local_48;
  long lStack_40;
  
  funcName_local.super_IString.str._M_len = funcName.super_IString.str._M_str;
  auStack_68 = funcName.super_IString.str._M_len;
  iVar5 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
          ::find(&(this->exportedPrimaryFuncs)._M_t,(key_type *)auStack_68);
  if ((_Rb_tree_header *)iVar5._M_node ==
      &(this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header) {
    pCVar1 = this->config;
    if (pCVar1->minimizeNewExportNames == true) {
      do {
        pCVar1 = this->config;
        Names::MinifiedNameGenerator::getName_abi_cxx11_((string *)local_88,&this->minified);
        plVar6 = (long *)std::__cxx11::string::replace
                                   ((ulong)local_88,0,(char *)0x0,
                                    (ulong)(pCVar1->newExportPrefix)._M_dataplus._M_p);
        plVar10 = plVar6 + 2;
        if ((long *)*plVar6 == plVar10) {
          local_48 = (char *)*plVar10;
          lStack_40 = plVar6[3];
          funcName_local.super_IString.str._M_str = (char *)&local_48;
        }
        else {
          local_48 = (char *)*plVar10;
          funcName_local.super_IString.str._M_str = (char *)*plVar6;
        }
        pIVar2 = (IString *)plVar6[1];
        *plVar6 = (long)plVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        s._M_str = (char *)0x0;
        s._M_len = (size_t)funcName_local.super_IString.str._M_str;
        sVar11 = IString::interned(pIVar2,s,SUB81(plVar10,0));
        if ((char **)funcName_local.super_IString.str._M_str != &local_48) {
          operator_delete(funcName_local.super_IString.str._M_str,(ulong)(local_48 + 1));
        }
        if ((Function *)local_88._0_8_ != (Function *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
        }
        pEVar7 = Module::getExportOrNull(this->primary,(Name)sVar11);
      } while (pEVar7 != (Export *)0x0);
    }
    else {
      pMVar3 = this->primary;
      local_88._0_8_ = (Function *)(local_88 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_88,funcName_local.super_IString.str._M_len,
                 (char *)((long)auStack_68 + funcName_local.super_IString.str._M_len));
      plVar6 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_88,0,(char *)0x0,
                                  (ulong)(pCVar1->newExportPrefix)._M_dataplus._M_p);
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_48 = (char *)*plVar10;
        lStack_40 = plVar6[3];
        funcName_local.super_IString.str._M_str = (char *)&local_48;
      }
      else {
        local_48 = (char *)*plVar10;
        funcName_local.super_IString.str._M_str = (char *)*plVar6;
      }
      pIVar2 = (IString *)plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      s_00._M_str = (char *)0x0;
      s_00._M_len = (size_t)funcName_local.super_IString.str._M_str;
      sVar11 = IString::interned(pIVar2,s_00,SUB81(plVar10,0));
      sVar11 = (string_view)Names::getValidExportName(pMVar3,(Name)sVar11);
      if ((char **)funcName_local.super_IString.str._M_str != &local_48) {
        operator_delete(funcName_local.super_IString.str._M_str,(ulong)(local_48 + 1));
      }
      if ((Function *)local_88._0_8_ != (Function *)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
    }
    pMVar3 = this->primary;
    funcName_local.super_IString.str._M_str = (char *)operator_new(0x30);
    ((string_view *)((long)funcName_local.super_IString.str._M_str + 0x10))->_M_str =
         (char *)auStack_68;
    ((string_view *)((long)funcName_local.super_IString.str._M_str + 0x20))->_M_len =
         funcName_local.super_IString.str._M_len;
    *(string_view *)funcName_local.super_IString.str._M_str = sVar11;
    *(undefined4 *)&((string_view *)((long)funcName_local.super_IString.str._M_str + 0x10))->_M_len
         = 0;
    *(undefined1 *)&((string_view *)((long)funcName_local.super_IString.str._M_str + 0x20))->_M_str
         = 0;
    Module::addExport(pMVar3,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                             &funcName_local.super_IString.str._M_str);
    if (funcName_local.super_IString.str._M_str != (char *)0x0) {
      operator_delete(funcName_local.super_IString.str._M_str,0x30);
    }
    psVar8 = (string_view *)
             std::
             map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
             ::operator[](&this->exportedPrimaryFuncs,(key_type *)auStack_68);
    *psVar8 = sVar11;
  }
  else {
    sVar11._M_len = (size_t)iVar5._M_node[1]._M_left;
    sVar11._M_str = (char *)iVar5._M_node[1]._M_right;
  }
  name.super_IString.str._M_str = (char *)funcName_local.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)auStack_68;
  pFVar9 = Module::getFunctionOrNull(this->secondary,name);
  if (pFVar9 == (Function *)0x0) {
    name_00.super_IString.str._M_str = (char *)funcName_local.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)auStack_68;
    pFVar9 = Module::getFunction(this->primary,name_00);
    funcName_local.super_IString.str._M_str = (char *)0x0;
    local_48 = (char *)0x0;
    name_01.super_IString.str._M_str = (char *)auStack_68;
    name_01.super_IString.str._M_len = (size_t)local_88;
    Builder::makeFunction
              (name_01,(HeapType)funcName_local.super_IString.str._M_len,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(pFVar9->type).id,
               (Expression *)&funcName_local.super_IString.str._M_str);
    if (funcName_local.super_IString.str._M_str != (char *)0x0) {
      operator_delete(funcName_local.super_IString.str._M_str,
                      (long)local_48 - (long)funcName_local.super_IString.str._M_str);
    }
    *(bool *)(local_88._0_8_ + 0x10) = (pFVar9->super_Importable).super_Named.hasExplicitName;
    pcVar4 = (this->config->importNamespace).super_IString.str._M_str;
    (((Name *)(local_88._0_8_ + 0x18))->super_IString).str._M_len =
         (this->config->importNamespace).super_IString.str._M_len;
    *(char **)(local_88._0_8_ + 0x20) = pcVar4;
    *(string_view *)(local_88._0_8_ + 0x28) = sVar11;
    Module::addFunction(this->secondary,
                        (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)local_88
                       );
    if ((Function *)local_88._0_8_ != (Function *)0x0) {
      std::default_delete<wasm::Function>::operator()
                ((default_delete<wasm::Function> *)local_88,(Function *)local_88._0_8_);
    }
  }
  return;
}

Assistant:

void ModuleSplitter::exportImportFunction(Name funcName) {
  Name exportName;
  // If the function is already exported, use the existing export name.
  // Otherwise, create a new export for it.
  auto exportIt = exportedPrimaryFuncs.find(funcName);
  if (exportIt != exportedPrimaryFuncs.end()) {
    exportName = exportIt->second;
  } else {
    if (config.minimizeNewExportNames) {
      do {
        exportName = config.newExportPrefix + minified.getName();
      } while (primary.getExportOrNull(exportName) != nullptr);
    } else {
      exportName = Names::getValidExportName(
        primary, config.newExportPrefix + funcName.toString());
    }
    primary.addExport(
      Builder::makeExport(exportName, funcName, ExternalKind::Function));
    exportedPrimaryFuncs[funcName] = exportName;
  }
  // Import the function if it is not already imported into the secondary
  // module.
  if (secondary.getFunctionOrNull(funcName) == nullptr) {
    auto primaryFunc = primary.getFunction(funcName);
    auto func = Builder::makeFunction(funcName, primaryFunc->type, {});
    func->hasExplicitName = primaryFunc->hasExplicitName;
    func->module = config.importNamespace;
    func->base = exportName;
    secondary.addFunction(std::move(func));
  }
}